

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_dr_mp3_read_pcm_frames_s16(ma_dr_mp3 *pMP3,ma_uint64 framesToRead,ma_int16 *pBufferOut)

{
  ma_uint32 mVar1;
  ma_uint64 mVar2;
  ulong uVar3;
  
  if ((pMP3 != (ma_dr_mp3 *)0x0) && (pMP3->onRead != (ma_dr_mp3_read_proc)0x0)) {
    mVar2 = 0;
    while( true ) {
      if (framesToRead == 0) {
        return mVar2;
      }
      uVar3 = framesToRead & 0xffffffff;
      if (pMP3->pcmFramesRemainingInMP3Frame <= framesToRead) {
        uVar3 = (ulong)pMP3->pcmFramesRemainingInMP3Frame;
      }
      if (pBufferOut != (ma_int16 *)0x0) {
        memcpy(pBufferOut + mVar2 * pMP3->channels,
               pMP3->pcmFrames +
               (ulong)pMP3->mp3FrameChannels * (ulong)pMP3->pcmFramesConsumedInMP3Frame * 2,
               pMP3->channels * uVar3 * 2);
      }
      pMP3->currentPCMFrame = pMP3->currentPCMFrame + uVar3;
      pMP3->pcmFramesConsumedInMP3Frame = pMP3->pcmFramesConsumedInMP3Frame + (int)uVar3;
      pMP3->pcmFramesRemainingInMP3Frame = pMP3->pcmFramesRemainingInMP3Frame - (int)uVar3;
      mVar2 = mVar2 + uVar3;
      framesToRead = framesToRead - uVar3;
      if (framesToRead == 0) break;
      mVar1 = ma_dr_mp3_decode_next_frame_ex(pMP3,(ma_dr_mp3d_sample_t *)pMP3->pcmFrames);
      if (mVar1 == 0) {
        return mVar2;
      }
    }
    return mVar2;
  }
  return 0;
}

Assistant:

MA_API ma_uint64 ma_dr_mp3_read_pcm_frames_s16(ma_dr_mp3* pMP3, ma_uint64 framesToRead, ma_int16* pBufferOut)
{
    if (pMP3 == NULL || pMP3->onRead == NULL) {
        return 0;
    }
#if !defined(MA_DR_MP3_FLOAT_OUTPUT)
    return ma_dr_mp3_read_pcm_frames_raw(pMP3, framesToRead, pBufferOut);
#else
    {
        float pTempF32[4096];
        ma_uint64 totalPCMFramesRead = 0;
        while (totalPCMFramesRead < framesToRead) {
            ma_uint64 framesJustRead;
            ma_uint64 framesRemaining = framesToRead - totalPCMFramesRead;
            ma_uint64 framesToReadNow = MA_DR_MP3_COUNTOF(pTempF32) / pMP3->channels;
            if (framesToReadNow > framesRemaining) {
                framesToReadNow = framesRemaining;
            }
            framesJustRead = ma_dr_mp3_read_pcm_frames_raw(pMP3, framesToReadNow, pTempF32);
            if (framesJustRead == 0) {
                break;
            }
            ma_dr_mp3_f32_to_s16((ma_int16*)MA_DR_MP3_OFFSET_PTR(pBufferOut, sizeof(ma_int16) * totalPCMFramesRead * pMP3->channels), pTempF32, framesJustRead * pMP3->channels);
            totalPCMFramesRead += framesJustRead;
        }
        return totalPCMFramesRead;
    }
#endif
}